

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::Attach(Debugger *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((this->running == true) && ((this->manager->helperCode)._M_string_length != 0)) {
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(lua_State_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp:64:22)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(lua_State_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp:64:22)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    ExecuteOnLuaThread(this,(Executor *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  return;
}

Assistant:

void Debugger::Attach() {
	if (!running)
		return;

	// execute helper code
	if (!manager->helperCode.empty()) {
		ExecuteOnLuaThread([this](lua_State *L) {
			const int t = lua_gettop(L);
			// 判断是不是主lua_state
			int ret = lua_pushthread(L);
			if (ret == 1) {
				const int r = luaL_loadstring(L, manager->helperCode.c_str());
				if (r == LUA_OK) {
					if (lua_pcall(L, 0, 0, 0) != LUA_OK) {
						std::string msg = lua_tostring(L, -1);
						printf("msg: %s", msg.c_str());
					}
				}
			}
			lua_settop(L, t);
		});
	}
}